

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanCommandBuffer.hpp
# Opt level: O0

void __thiscall
VulkanUtilities::VulkanCommandBuffer::DrawIndexed
          (VulkanCommandBuffer *this,uint32_t IndexCount,uint32_t InstanceCount,uint32_t FirstIndex,
          int32_t VertexOffset,uint32_t FirstInstance)

{
  bool bVar1;
  Char *pCVar2;
  undefined4 in_register_0000000c;
  undefined1 local_b8 [8];
  string msg_3;
  string msg_2;
  string msg_1;
  undefined1 local_48 [8];
  string msg;
  uint32_t FirstInstance_local;
  int32_t VertexOffset_local;
  uint32_t FirstIndex_local;
  uint32_t InstanceCount_local;
  uint32_t IndexCount_local;
  VulkanCommandBuffer *this_local;
  
  msg.field_2._12_4_ = FirstInstance;
  if (this->m_VkCmdBuffer == (VkCommandBuffer)0x0) {
    Diligent::FormatString<char[26],char[32]>
              ((string *)local_48,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_VkCmdBuffer != VK_NULL_HANDLE",
               (char (*) [32])CONCAT44(in_register_0000000c,FirstIndex));
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    Diligent::DebugAssertionFailed
              (pCVar2,"DrawIndexed",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/VulkanUtilities/VulkanCommandBuffer.hpp"
               ,0x7e);
    std::__cxx11::string::~string((string *)local_48);
  }
  bVar1 = IsInRenderScope(this);
  if (!bVar1) {
    Diligent::FormatString<char[154]>
              ((string *)((long)&msg_2.field_2 + 8),
               (char (*) [154])
               "vkCmdDrawIndexed() must be called inside render pass (https://registry.khronos.org/vulkan/specs/latest/html/vkspec.html#VUID-vkCmdDrawIndexed-renderpass)"
              );
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    Diligent::DebugAssertionFailed
              (pCVar2,"DrawIndexed",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/VulkanUtilities/VulkanCommandBuffer.hpp"
               ,0x81);
    std::__cxx11::string::~string((string *)(msg_2.field_2._M_local_buf + 8));
  }
  if ((this->m_State).GraphicsPipeline == (VkPipeline)0x0) {
    Diligent::FormatString<char[27]>
              ((string *)((long)&msg_3.field_2 + 8),(char (*) [27])"No graphics pipeline bound");
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    Diligent::DebugAssertionFailed
              (pCVar2,"DrawIndexed",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/VulkanUtilities/VulkanCommandBuffer.hpp"
               ,0x82);
    std::__cxx11::string::~string((string *)(msg_3.field_2._M_local_buf + 8));
  }
  if ((this->m_State).IndexBuffer == (VkBuffer)0x0) {
    Diligent::FormatString<char[22]>((string *)local_b8,(char (*) [22])"No index buffer bound");
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    Diligent::DebugAssertionFailed
              (pCVar2,"DrawIndexed",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/VulkanUtilities/VulkanCommandBuffer.hpp"
               ,0x83);
    std::__cxx11::string::~string((string *)local_b8);
  }
  (*vkCmdDrawIndexed)(this->m_VkCmdBuffer,IndexCount,InstanceCount,FirstIndex,VertexOffset,
                      msg.field_2._12_4_);
  return;
}

Assistant:

__forceinline void DrawIndexed(uint32_t IndexCount, uint32_t InstanceCount, uint32_t FirstIndex, int32_t VertexOffset, uint32_t FirstInstance)
    {
        VERIFY_EXPR(m_VkCmdBuffer != VK_NULL_HANDLE);
        VERIFY(IsInRenderScope(),
               "vkCmdDrawIndexed() must be called inside render pass "
               "(https://registry.khronos.org/vulkan/specs/latest/html/vkspec.html#VUID-vkCmdDrawIndexed-renderpass)");
        VERIFY(m_State.GraphicsPipeline != VK_NULL_HANDLE, "No graphics pipeline bound");
        VERIFY(m_State.IndexBuffer != VK_NULL_HANDLE, "No index buffer bound");

        vkCmdDrawIndexed(m_VkCmdBuffer, IndexCount, InstanceCount, FirstIndex, VertexOffset, FirstInstance);
    }